

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_create_list(lysc_node *schema,ly_path_predicate *predicates,lyxp_var *vars,
                      ly_bool store_only,lyd_node **node)

{
  ly_ctx *ctx;
  lysc_type *type;
  void *value_00;
  lysc_node *plVar1;
  undefined8 uVar2;
  size_t value_len;
  char *local_98;
  char *local_88;
  uint64_t u;
  lyxp_var *var;
  lyd_value val;
  lyd_value *value;
  lyd_node *key;
  lyd_node *list;
  lyd_node **pplStack_30;
  LY_ERR ret;
  lyd_node **node_local;
  lyxp_var *plStack_20;
  ly_bool store_only_local;
  lyxp_var *vars_local;
  ly_path_predicate *predicates_local;
  lysc_node *schema_local;
  
  list._4_4_ = 0;
  key = (lyd_node *)0x0;
  pplStack_30 = node;
  node_local._7_1_ = store_only;
  plStack_20 = vars;
  vars_local = (lyxp_var *)predicates;
  predicates_local = (ly_path_predicate *)schema;
  memset(&var,0,0x28);
  if (((short)predicates_local->type != 0x10) ||
     ((predicates_local->type & 0x2000000) != LY_PATH_PREDTYPE_POSITION)) {
    __assert_fail("(schema->nodetype == LYS_LIST) && !(schema->flags & LYS_KEYLESS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x94,
                  "LY_ERR lyd_create_list(const struct lysc_node *, const struct ly_path_predicate *, const struct lyxp_var *, ly_bool, struct lyd_node **)"
                 );
  }
  list._4_4_ = lyd_create_inner((lysc_node *)predicates_local,&key);
  if (list._4_4_ == LY_SUCCESS) {
    ly_log_location((lysc_node *)predicates_local,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    local_88 = (char *)0x0;
    while( true ) {
      if (vars_local == (lyxp_var *)0x0) {
        local_98 = (char *)0x0;
      }
      else {
        local_98 = vars_local[-1].value;
      }
      if (local_98 <= local_88) break;
      if (*(int *)((long)vars_local + (long)local_88 * 0x38) == 3) {
        list._4_4_ = lyxp_vars_find(*(ly_ctx **)(predicates_local->field_1).field_1.key,plStack_20,
                                    *(char **)((long)vars_local + (long)local_88 * 0x38 + 0x10),0,
                                    (lyxp_var **)&u);
        if (list._4_4_ != LY_SUCCESS) goto LAB_0013de3f;
        ly_log_location(*(lysc_node **)((long)vars_local + (long)local_88 * 0x38 + 8),
                        (lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
        ctx = *(ly_ctx **)(predicates_local->field_1).field_1.key;
        type = *(lysc_type **)(*(long *)((long)vars_local + (long)local_88 * 0x38 + 8) + 0x60);
        value_00 = *(void **)(u + 8);
        value_len = strlen(*(char **)(u + 8));
        list._4_4_ = lyd_value_store(ctx,(lyd_value *)&var,type,value_00,value_len,'\0',
                                     node_local._7_1_,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,0x3f3
                                     ,*(lysc_node **)((long)vars_local + (long)local_88 * 0x38 + 8),
                                     (ly_bool *)0x0);
        ly_log_location_revert(1,0,0,0);
        if (list._4_4_ != LY_SUCCESS) goto LAB_0013de3f;
        val.field_2._16_8_ = &var;
      }
      else {
        if (*(int *)((long)vars_local + (long)local_88 * 0x38) != 1) {
          __assert_fail("predicates[u].type == LY_PATH_PREDTYPE_LIST",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                        ,0xac,
                        "LY_ERR lyd_create_list(const struct lysc_node *, const struct ly_path_predicate *, const struct lyxp_var *, ly_bool, struct lyd_node **)"
                       );
        }
        val.field_2._16_8_ = (long)vars_local + (long)local_88 * 0x38 + 0x10;
      }
      list._4_4_ = lyd_create_term2(*(lysc_node **)((long)vars_local + (long)local_88 * 0x38 + 8),
                                    (lyd_value *)val.field_2._16_8_,(lyd_node **)&value);
      if (val._canonical != (char *)0x0) {
        plVar1 = (predicates_local->field_1).field_1.key;
        uVar2._0_2_ = plVar1->nodetype;
        uVar2._2_2_ = plVar1->flags;
        uVar2._4_1_ = plVar1->hash[0];
        uVar2._5_1_ = plVar1->hash[1];
        uVar2._6_1_ = plVar1->hash[2];
        uVar2._7_1_ = plVar1->hash[3];
        (**(code **)(*(long *)(val._canonical + 0x10) + 0x38))(uVar2);
        memset(&var,0,0x28);
      }
      if (list._4_4_ != LY_SUCCESS) goto LAB_0013de3f;
      lyd_insert_node(key,(lyd_node **)0x0,(lyd_node *)value,0);
      local_88 = local_88 + 1;
    }
    lyd_hash(key);
    *pplStack_30 = key;
    key = (lyd_node *)0x0;
  }
LAB_0013de3f:
  ly_log_location_revert(1,0,0,0);
  lyd_free_tree(key);
  return list._4_4_;
}

Assistant:

LY_ERR
lyd_create_list(const struct lysc_node *schema, const struct ly_path_predicate *predicates, const struct lyxp_var *vars,
        ly_bool store_only, struct lyd_node **node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_node *list = NULL, *key;
    const struct lyd_value *value;
    struct lyd_value val = {0};
    struct lyxp_var *var;
    LY_ARRAY_COUNT_TYPE u;

    assert((schema->nodetype == LYS_LIST) && !(schema->flags & LYS_KEYLESS));

    /* create list */
    LY_CHECK_GOTO(ret = lyd_create_inner(schema, &list), cleanup);

    LOG_LOCSET(schema, NULL);

    /* create and insert all the keys */
    LY_ARRAY_FOR(predicates, u) {
        if (predicates[u].type == LY_PATH_PREDTYPE_LIST_VAR) {
            /* find the var */
            if ((ret = lyxp_vars_find(schema->module->ctx, vars, predicates[u].variable, 0, &var))) {
                goto cleanup;
            }

            /* store the value */
            LOG_LOCSET(predicates[u].key, NULL);
            ret = lyd_value_store(schema->module->ctx, &val, ((struct lysc_node_leaf *)predicates[u].key)->type,
                    var->value, strlen(var->value), 0, store_only, NULL, LY_VALUE_JSON, NULL, LYD_HINT_DATA, predicates[u].key, NULL);
            LOG_LOCBACK(1, 0);
            LY_CHECK_GOTO(ret, cleanup);

            value = &val;
        } else {
            assert(predicates[u].type == LY_PATH_PREDTYPE_LIST);
            value = &predicates[u].value;
        }

        ret = lyd_create_term2(predicates[u].key, value, &key);
        if (val.realtype) {
            val.realtype->plugin->free(schema->module->ctx, &val);
            memset(&val, 0, sizeof val);
        }
        LY_CHECK_GOTO(ret, cleanup);
        lyd_insert_node(list, NULL, key, LYD_INSERT_NODE_DEFAULT);
    }

    /* hash having all the keys */
    lyd_hash(list);

    /* success */
    *node = list;
    list = NULL;

cleanup:
    LOG_LOCBACK(1, 0);
    lyd_free_tree(list);
    return ret;
}